

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O3

void __thiscall absl::lts_20250127::time_internal::cctz::time_zone::Impl::Impl(Impl *this)

{
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"UTC","");
  TimeZoneIf::UTC();
  return;
}

Assistant:

time_zone::Impl::Impl() : name_("UTC"), zone_(TimeZoneIf::UTC()) {}